

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O1

string * __thiscall
cmTimestamp::FileModificationTime
          (string *__return_storage_ptr__,cmTimestamp *this,char *path,string *formatString,
          bool utcFlag)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  undefined7 in_register_00000081;
  uint32_t microseconds;
  time_t timeT;
  string real_path;
  uv_fs_t req;
  allocator<char> local_22d;
  undefined4 local_22c;
  string local_228;
  string local_208;
  undefined1 local_1e8 [224];
  time_t local_108;
  long local_100;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1e8,path,&local_22d);
  cmSystemTools::GetRealPathResolvingWindowsSubst(&local_208,(string *)local_1e8,(string *)0x0);
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  bVar2 = cmsys::SystemTools::FileExists(&local_208);
  if (bVar2) {
    local_22c = (undefined4)CONCAT71(in_register_00000081,utcFlag);
    microseconds = 0;
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)local_1e8,local_208._M_dataplus._M_p,
                       (uv_fs_cb)0x0);
    if (iVar3 == 0) {
      microseconds = (int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_100),8) >> 7) -
                     (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_100),0xc) >> 0x1f);
      timeT = local_108;
    }
    else {
      timeT = 0;
    }
    uv_fs_req_cleanup((uv_fs_t *)local_1e8);
    pcVar1 = (formatString->_M_dataplus)._M_p;
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,pcVar1,pcVar1 + formatString->_M_string_length);
    CreateTimestampFromTimeT
              (__return_storage_ptr__,this,timeT,microseconds,&local_228,local_22c._0_1_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::FileModificationTime(const char* path,
                                              const std::string& formatString,
                                              bool utcFlag) const
{
  std::string real_path =
    cmSystemTools::GetRealPathResolvingWindowsSubst(path);

  if (!cmsys::SystemTools::FileExists(real_path)) {
    return std::string();
  }

  // use libuv's implementation of stat(2) to get the file information
  time_t mtime = 0;
  uint32_t microseconds = 0;
  uv_fs_t req;
  if (uv_fs_stat(nullptr, &req, real_path.c_str(), nullptr) == 0) {
    mtime = static_cast<time_t>(req.statbuf.st_mtim.tv_sec);
    // tv_nsec has nanosecond resolution, but we truncate it to microsecond
    // resolution in order to be consistent with cmTimestamp::CurrentTime()
    microseconds = static_cast<uint32_t>(req.statbuf.st_mtim.tv_nsec / 1000);
  }
  uv_fs_req_cleanup(&req);

  return this->CreateTimestampFromTimeT(mtime, microseconds, formatString,
                                        utcFlag);
}